

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjFileMtlImporter::getColorRGBA(ObjFileMtlImporter *this,aiColor3D *pColor)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  Assimp AVar4;
  char *pcVar5;
  byte *pbVar6;
  char *pcVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  ai_real ret;
  char buffer [1024];
  ai_real local_440;
  ai_real local_43c;
  Assimp local_438 [1032];
  
  if (pColor == (aiColor3D *)0x0) {
    __assert_fail("__null != pColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Obj/ObjFileMtlImporter.cpp"
                  ,0xf2,"void Assimp::ObjFileMtlImporter::getColorRGBA(aiColor3D *)");
  }
  pcVar7 = (this->m_DataIt)._M_current;
  pcVar5 = (this->m_DataItEnd)._M_current;
  pcVar1 = pcVar5 + -1;
  if (pcVar1 != pcVar7 && pcVar7 != pcVar5) {
    do {
      if (((*pcVar7 != ' ') && (*pcVar7 != '\t')) || (pcVar7 = pcVar7 + 1, pcVar7 == pcVar5)) break;
    } while (pcVar7 != pcVar1);
  }
  lVar9 = 0;
  while( true ) {
    pcVar3 = pcVar7 + lVar9;
    AVar4 = *(Assimp *)(pcVar7 + lVar9);
    if ((((ulong)(byte)AVar4 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) ||
       ((pcVar3 == pcVar5 || (pcVar3 == pcVar1)))) goto LAB_0069faeb;
    local_438[lVar9] = AVar4;
    if (lVar9 == 0x3fe) break;
    lVar9 = lVar9 + 1;
  }
  lVar9 = 0x3ff;
LAB_0069faeb:
  local_438[lVar9] = (Assimp)0x0;
  local_440 = 0.0;
  fast_atoreal_move<float>(local_438,(char *)&local_440,(float *)0x1,SUB81(pcVar5,0));
  (this->m_DataIt)._M_current = pcVar3;
  pColor->r = local_440;
  pbVar8 = (byte *)(this->m_DataIt)._M_current;
  if (*pbVar8 < 0xe) {
    local_43c = 0.0;
    local_440 = 0.0;
    if ((0x3401U >> (*pbVar8 & 0x1f) & 1) != 0) goto LAB_0069fb37;
  }
  pbVar6 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar2 = pbVar6 + -1;
  if (pbVar2 != pbVar8 && pbVar8 != pbVar6) {
    while ((*pbVar8 == 0x20 || (*pbVar8 == 9))) {
      pbVar8 = pbVar8 + 1;
      if ((pbVar8 == pbVar6) || (pbVar8 == pbVar2)) break;
    }
  }
  lVar9 = 0;
  while( true ) {
    pbVar10 = pbVar8 + lVar9;
    AVar4 = *(Assimp *)(pbVar8 + lVar9);
    if (((((ulong)(byte)AVar4 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0))
        || (pbVar10 == pbVar6)) || (pbVar10 == pbVar2)) goto LAB_0069fbc0;
    local_438[lVar9] = AVar4;
    if (lVar9 == 0x3fe) break;
    lVar9 = lVar9 + 1;
  }
  lVar9 = 0x3ff;
LAB_0069fbc0:
  local_438[lVar9] = (Assimp)0x0;
  local_440 = 0.0;
  fast_atoreal_move<float>(local_438,(char *)&local_440,(float *)0x1,SUB81(pbVar6,0));
  (this->m_DataIt)._M_current = (char *)pbVar10;
  pbVar2 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar8 = pbVar2 + -1;
  if (pbVar10 != pbVar8 && pbVar10 != pbVar2) {
    while ((*pbVar10 == 0x20 || (*pbVar10 == 9))) {
      pbVar10 = pbVar10 + 1;
      if ((pbVar10 == pbVar2) || (pbVar10 == pbVar8)) break;
    }
  }
  lVar9 = 0;
  local_43c = local_440;
  while( true ) {
    pbVar6 = pbVar10 + lVar9;
    AVar4 = *(Assimp *)(pbVar10 + lVar9);
    if ((((ulong)(byte)AVar4 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) ||
       ((pbVar6 == pbVar2 || (pbVar6 == pbVar8)))) goto LAB_0069fc62;
    local_438[lVar9] = AVar4;
    if (lVar9 == 0x3fe) break;
    lVar9 = lVar9 + 1;
  }
  lVar9 = 0x3ff;
LAB_0069fc62:
  local_438[lVar9] = (Assimp)0x0;
  local_440 = 0.0;
  fast_atoreal_move<float>(local_438,(char *)&local_440,(float *)0x1,SUB81(pbVar8,0));
  (this->m_DataIt)._M_current = (char *)pbVar6;
LAB_0069fb37:
  pColor->g = local_43c;
  pColor->b = local_440;
  return;
}

Assistant:

void ObjFileMtlImporter::getColorRGBA( aiColor3D *pColor )
{
    ai_assert( NULL != pColor );

    ai_real r( 0.0 ), g( 0.0 ), b( 0.0 );
    m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, r );
    pColor->r = r;

    // we have to check if color is default 0 with only one token
    if( !IsLineEnd( *m_DataIt ) ) {
        m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, g );
        m_DataIt = getFloat<DataArrayIt>( m_DataIt, m_DataItEnd, b );
    }
    pColor->g = g;
    pColor->b = b;
}